

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Scream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  FSoundID *sound_id;
  AActor *ent;
  char *__assertion;
  float attenuation;
  FSoundID local_10;
  FSoundID local_c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004017e1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004017e1;
        }
        goto LAB_0040177f;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_004017d1;
    ent = (AActor *)0x0;
LAB_0040177f:
    iVar1 = (ent->DeathSound).super_FSoundID.ID;
    if (iVar1 != 0) {
      if (((ent->flags2).Value & 0x8000) == 0) {
        sound_id = &local_10;
        attenuation = 1.0;
        local_10.ID = iVar1;
      }
      else {
        sound_id = &local_c;
        attenuation = 0.0;
        local_c.ID = iVar1;
      }
      S_Sound(ent,2,sound_id,1.0,attenuation);
    }
    return 0;
  }
LAB_004017d1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004017e1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc62,"int AF_AActor_A_Scream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Scream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->DeathSound)
	{
		// Check for bosses.
		if (self->flags2 & MF2_BOSS)
		{
			// full volume
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
	}
	return 0;
}